

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O0

void helper_sysexit_x86_64(CPUX86State *env,int dflag)

{
  uintptr_t unaff_retaddr;
  int cpl;
  int dflag_local;
  CPUX86State *env_local;
  
  if ((env->sysenter_cs != 0) && ((env->hflags & 3) == 0)) {
    if (dflag == 2) {
      cpu_x86_load_seg_cache(env,1,env->sysenter_cs + 0x20 & 0xfffc | 3,0,0xffffffff,0xe0fb00);
      cpu_x86_load_seg_cache(env,2,env->sysenter_cs + 0x28 & 0xfffc | 3,0,0xffffffff,0xc0f300);
    }
    else {
      cpu_x86_load_seg_cache(env,1,env->sysenter_cs + 0x10 & 0xfffc | 3,0,0xffffffff,0xc0fb00);
      cpu_x86_load_seg_cache(env,2,env->sysenter_cs + 0x18 & 0xfffc | 3,0,0xffffffff,0xc0f300);
    }
    env->regs[4] = env->regs[1];
    env->eip = env->regs[2];
    return;
  }
  raise_exception_err_ra_x86_64(env,0xd,0,unaff_retaddr);
}

Assistant:

void helper_sysexit(CPUX86State *env, int dflag)
{
    int cpl;

    cpl = env->hflags & HF_CPL_MASK;
    if (env->sysenter_cs == 0 || cpl != 0) {
        raise_exception_err_ra(env, EXCP0D_GPF, 0, GETPC());
    }
#ifdef TARGET_X86_64
    if (dflag == 2) {
        cpu_x86_load_seg_cache(env, R_CS, ((env->sysenter_cs + 32) & 0xfffc) |
                               3, 0, 0xffffffff,
                               DESC_G_MASK | DESC_B_MASK | DESC_P_MASK |
                               DESC_S_MASK | (3 << DESC_DPL_SHIFT) |
                               DESC_CS_MASK | DESC_R_MASK | DESC_A_MASK |
                               DESC_L_MASK);
        cpu_x86_load_seg_cache(env, R_SS, ((env->sysenter_cs + 40) & 0xfffc) |
                               3, 0, 0xffffffff,
                               DESC_G_MASK | DESC_B_MASK | DESC_P_MASK |
                               DESC_S_MASK | (3 << DESC_DPL_SHIFT) |
                               DESC_W_MASK | DESC_A_MASK);
    } else
#endif
    {
        cpu_x86_load_seg_cache(env, R_CS, ((env->sysenter_cs + 16) & 0xfffc) |
                               3, 0, 0xffffffff,
                               DESC_G_MASK | DESC_B_MASK | DESC_P_MASK |
                               DESC_S_MASK | (3 << DESC_DPL_SHIFT) |
                               DESC_CS_MASK | DESC_R_MASK | DESC_A_MASK);
        cpu_x86_load_seg_cache(env, R_SS, ((env->sysenter_cs + 24) & 0xfffc) |
                               3, 0, 0xffffffff,
                               DESC_G_MASK | DESC_B_MASK | DESC_P_MASK |
                               DESC_S_MASK | (3 << DESC_DPL_SHIFT) |
                               DESC_W_MASK | DESC_A_MASK);
    }
    env->regs[R_ESP] = env->regs[R_ECX];
    env->eip = env->regs[R_EDX];
}